

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O2

void __thiscall
node::BlockAssembler::BlockAssembler
          (BlockAssembler *this,Chainstate *chainstate,CTxMemPool *mempool,Options *options)

{
  undefined1 *puVar1;
  ulong uVar2;
  undefined1 *puVar3;
  bool bVar4;
  undefined7 uVar5;
  undefined8 uVar6;
  CTxMemPool *pCVar7;
  undefined1 *puVar8;
  long in_FS_OFFSET;
  bool local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->pblocktemplate)._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->inBlock)._M_h);
  this->chainparams = (chainstate->m_chainman->m_options).chainparams;
  pCVar7 = (CTxMemPool *)0x0;
  if ((options->super_BlockCreateOptions).use_mempool != false) {
    pCVar7 = mempool;
  }
  this->m_mempool = pCVar7;
  this->m_chainstate = chainstate;
  bVar4 = (options->super_BlockCreateOptions).use_mempool;
  uVar5 = *(undefined7 *)&(options->super_BlockCreateOptions).field_0x1;
  puVar1 = (undefined1 *)(options->super_BlockCreateOptions).coinbase_max_additional_weight;
  uVar2 = (options->super_BlockCreateOptions).coinbase_output_max_additional_sigops;
  puVar3 = (undefined1 *)options->nBlockMaxWeight;
  local_48 = (options->blockMinFeeRate).nSatoshisPerK;
  uStack_40._0_1_ = options->test_block_validity;
  uStack_40._1_1_ = options->print_modified_fee;
  uStack_40._2_6_ = *(undefined6 *)&options->field_0x2a;
  local_49 = puVar1 < (undefined1 *)0x3cf961;
  inline_assertion_check<true,bool>
            (&local_49,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/miner.cpp"
             ,0x46,"ClampOptions",
             "options.coinbase_max_additional_weight <= DEFAULT_BLOCK_MAX_WEIGHT");
  local_49 = uVar2 < 0x13881;
  inline_assertion_check<true,bool>
            (&local_49,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/miner.cpp"
             ,0x47,"ClampOptions",
             "options.coinbase_output_max_additional_sigops <= MAX_BLOCK_SIGOPS_COST");
  uVar6 = uStack_40;
  puVar8 = &LAB_003cf960;
  if (puVar3 < &LAB_003cf960) {
    puVar8 = puVar3;
  }
  if (puVar3 < puVar1) {
    puVar8 = puVar1;
  }
  (this->m_options).super_BlockCreateOptions.use_mempool = bVar4;
  *(undefined7 *)&(this->m_options).super_BlockCreateOptions.field_0x1 = uVar5;
  (this->m_options).super_BlockCreateOptions.coinbase_max_additional_weight = (size_t)puVar1;
  (this->m_options).super_BlockCreateOptions.coinbase_output_max_additional_sigops = uVar2;
  (this->m_options).nBlockMaxWeight = (size_t)puVar8;
  *(undefined4 *)&(this->m_options).blockMinFeeRate.nSatoshisPerK = (undefined4)local_48;
  *(undefined4 *)((long)&(this->m_options).blockMinFeeRate.nSatoshisPerK + 4) = local_48._4_4_;
  (this->m_options).test_block_validity = (bool)(undefined1)uStack_40;
  (this->m_options).print_modified_fee = (bool)uStack_40._1_1_;
  *(undefined2 *)&(this->m_options).field_0x2a = uStack_40._2_2_;
  *(undefined4 *)&(this->m_options).field_0x2c = uStack_40._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  uStack_40 = uVar6;
  __stack_chk_fail();
}

Assistant:

BlockAssembler::BlockAssembler(Chainstate& chainstate, const CTxMemPool* mempool, const Options& options)
    : chainparams{chainstate.m_chainman.GetParams()},
      m_mempool{options.use_mempool ? mempool : nullptr},
      m_chainstate{chainstate},
      m_options{ClampOptions(options)}
{
}